

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

void __thiscall inja::Parser::append_function(Parser *this,Template *tmpl,Op op,uint num_args)

{
  pointer pBVar1;
  Op local_5;
  uint local_4;
  
  pBVar1 = (tmpl->bytecodes).super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (((tmpl->bytecodes).super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl
       .super__Vector_impl_data._M_start == pBVar1) || (pBVar1[-1].op != Push)) {
    std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
    emplace_back<inja::Bytecode::Op&,unsigned_int&>
              ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)tmpl,&local_5,&local_4);
  }
  else {
    pBVar1[-1].op = op;
    *(uint *)&pBVar1[-1].field_0x4 =
         *(uint *)&pBVar1[-1].field_0x4 & 0xc0000000 | num_args & 0x3fffffff;
  }
  return;
}

Assistant:

void append_function(Template& tmpl, Bytecode::Op op, unsigned int num_args) {
		// we can merge with back-to-back push
		if (!tmpl.bytecodes.empty()) {
			Bytecode& last = tmpl.bytecodes.back();
			if (last.op == Bytecode::Op::Push) {
				last.op = op;
				last.args = num_args;
				return;
			}
		}

		// otherwise just add it to the end
		tmpl.bytecodes.emplace_back(op, num_args);
	}